

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

int nng_stats_get(nng_stat **statp)

{
  int iVar1;
  
  iVar1 = nni_stat_snapshot(statp,&stats_root);
  return iVar1;
}

Assistant:

int
nng_stats_get(nng_stat **statp)
{
#ifdef NNG_ENABLE_STATS
	return (nni_stat_snapshot(statp, &stats_root));
#else
	NNI_ARG_UNUSED(statp);
	return (NNG_ENOTSUP);
#endif
}